

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchRelativeOffset
                   (INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                   ND_UINT8 RelOffsetSize)

{
  ND_UINT64 NVar1;
  ND_UINT8 RelOffsetSize_local;
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (Size < (ulong)Offset + (ulong)RelOffsetSize) {
    Instrux_local._4_4_ = 0x80000001;
  }
  else {
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffdffff | 0x20000;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xffffff0fffffffff | ((ulong)RelOffsetSize & 0xf) << 0x24;
    *(ushort *)&Instrux->field_0x14 = *(ushort *)&Instrux->field_0x14 & 0xff0f | (Offset & 0xf) << 4
    ;
    NVar1 = NdFetchData(Code + (int)(uint)Offset,RelOffsetSize);
    (Instrux->field_74).Displacement = (ND_UINT32)NVar1;
    Instrux->Length = Instrux->Length + RelOffsetSize;
    if (Instrux->Length < 0x10) {
      Instrux_local._4_4_ = 0;
    }
    else {
      Instrux_local._4_4_ = 0x80000003;
    }
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdFetchRelativeOffset(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 RelOffsetSize
    )
{
    // Make sure we don't outrun the buffer.
    RET_GT((ND_SIZET)Offset + RelOffsetSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasRelOffs = ND_TRUE;
    Instrux->RelOffsLength = RelOffsetSize;
    Instrux->RelOffsOffset = Offset;

    Instrux->RelativeOffset = (ND_UINT32)NdFetchData(Code + Offset, RelOffsetSize);

    Instrux->Length += RelOffsetSize;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}